

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
          *targets)

{
  bool bVar1;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_00;
  reference this_01;
  pointer pcVar2;
  pointer pcVar3;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *te;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *__range2;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  *targets_local;
  cmExportBuildFileGenerator *this_local;
  
  if (this->ExportSet == (cmExportSet *)0x0) {
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::operator=(targets,&this->Targets);
  }
  else {
    this_00 = cmExportSet::GetTargetExports(this->ExportSet);
    __end2 = std::
             vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ::begin(this_00);
    te = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
         std::
         vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                       *)&te), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                ::operator*(&__end2);
      pcVar2 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_01);
      if ((pcVar2->NamelinkOnly & 1U) == 0) {
        pcVar2 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                           (this_01);
        pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                           (this_01);
        std::
        vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
        ::emplace_back<std::__cxx11::string&,std::__cxx11::string&>
                  ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                    *)targets,&pcVar2->TargetName,&pcVar3->XcFrameworkLocation);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GetTargets(
  std::vector<TargetExport>& targets) const
{
  if (this->ExportSet) {
    for (std::unique_ptr<cmTargetExport> const& te :
         this->ExportSet->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      targets.emplace_back(te->TargetName, te->XcFrameworkLocation);
    }
    return;
  }
  targets = this->Targets;
}